

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdInitializeFundPsbt(void *handle,void **fund_handle)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  void *__s;
  undefined8 *in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiPsbtFundHandle *buffer;
  int result;
  string *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffff30;
  allocator local_99;
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  uint32_t in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  cfd::Initialize();
  if (in_RSI == (undefined8 *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x980;
    local_50.funcname = "CfdInitializeFundPsbt";
    cfd::core::logger::warn<>(&local_50,"fund handle is null.");
    local_72 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. fund handle is null.",&local_71);
    cfd::core::CfdException::CfdException
              (in_stack_ffffffffffffff30,error_code,in_stack_ffffffffffffff20);
    local_72 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"PsbtFund",&local_99);
  pvVar2 = cfd::capi::AllocBuffer(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  puVar3 = (undefined8 *)operator_new(0x18);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x601011);
  *(undefined8 **)((long)pvVar2 + 0x10) = puVar3;
  __s = operator_new(0x18);
  memset(__s,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x60104e);
  *(void **)((long)pvVar2 + 0x18) = __s;
  *(undefined8 *)((long)pvVar2 + 0x20) = 0x4034000000000000;
  *(undefined8 *)((long)pvVar2 + 0x30) = 0x4034000000000000;
  *(undefined8 *)((long)pvVar2 + 0x28) = 0x4008000000000000;
  *(undefined8 *)((long)pvVar2 + 0x38) = 0xffffffffffffffff;
  *in_RSI = pvVar2;
  return 0;
}

Assistant:

int CfdInitializeFundPsbt(void* handle, void** fund_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtFundHandle* buffer = nullptr;
  try {
    cfd::Initialize();
    if (fund_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "fund handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fund handle is null.");
    }

    buffer = static_cast<CfdCapiPsbtFundHandle*>(
        AllocBuffer(kPrefixPsbtFundHandle, sizeof(CfdCapiPsbtFundHandle)));
    buffer->utxos = new std::vector<UtxoData>();
    buffer->indexes = new std::vector<uint32_t>();
    buffer->fee_rate = 20.0;
    buffer->long_term_fee_rate = 20.0;
    buffer->dust_fee_rate = 3.0;
    buffer->knapsack_min_change = -1;
    *fund_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreeFundPsbt(handle, buffer);
  return result;
}